

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

int ConvolutionReverb::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  float *pfVar1;
  int iVar2;
  EffectData *data;
  ulong uVar3;
  ulong uVar4;
  float __x;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  MutexScopeLock mutexScope;
  
  data = UnityAudioEffectState::GetEffectData<ConvolutionReverb::EffectData>(state);
  mutexScope.mutex = data->mutex;
  Mutex::Lock(mutexScope.mutex);
  iVar2 = strncmp(name,"Impulse",7);
  if (iVar2 == 0) {
    SetupImpulse(data,data->numchannels,data->hopsize,data->samplerate);
    if ((int)((long)name[7] + -0x30) < data->numchannels) {
      pfVar1 = data->channels[(long)name[7] + -0x30].impulse;
      fVar6 = (float)(data->numpartitions * data->hopsize + -2) / (float)numsamples;
      uVar4 = 0;
      uVar3 = (ulong)(uint)numsamples;
      if (numsamples < 1) {
        uVar3 = uVar4;
      }
      fVar7 = 0.0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        __x = (float)(int)uVar4 * fVar6;
        fVar5 = floorf(__x);
        fVar8 = pfVar1[(int)fVar5];
        fVar8 = (__x - (float)(int)fVar5) * (pfVar1[(long)(int)fVar5 + 1] - fVar8) + fVar8;
        buffer[uVar4] = (fVar8 - fVar7) * (1.0 / fVar6);
        fVar7 = fVar8;
      }
    }
  }
  MutexScopeLock::~MutexScopeLock(&mutexScope);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        MutexScopeLock mutexScope(*data->mutex);
        if (strncmp(name, "Impulse", 7) == 0)
        {
            SetupImpulse(data, data->numchannels, data->hopsize, data->samplerate);
            int index = name[7] - '0';
            if (index >= data->numchannels)
                return UNITY_AUDIODSP_OK;
            const float* src = data->channels[index].impulse;
            float scale = (float)(data->hopsize * data->numpartitions - 2) / (float)numsamples;
            float prev_val = 0.0f, time_scale = 1.0f / scale;
            for (int n = 0; n < numsamples; n++)
            {
                // resample pre-integrated curve via box-filtering: f(x) = (F(x+dx)-F(x)) / dx
                float next_time = n * scale;
                int i = FastFloor(next_time);
                float next_val = src[i] + (src[i + 1] - src[i]) * (next_time - i);
                buffer[n] = (next_val - prev_val) * time_scale;
                prev_val = next_val;
            }
        }
        return UNITY_AUDIODSP_OK;
    }